

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ext_loader_impl.cpp
# Opt level: O0

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)

{
  bool bVar1;
  void *in_RDI;
  loader_impl_ext_handle_lib_type ext;
  iterator __end1;
  iterator __begin1;
  vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>
  *__range1;
  loader_impl_ext_handle_lib_type *in_stack_ffffffffffffff98;
  loader_impl_ext_handle_lib_type *in_stack_ffffffffffffffa0;
  long local_30;
  __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
  local_18 [2];
  void *local_8;
  
  local_8 = in_RDI;
  local_18[0]._M_current =
       (loader_impl_ext_handle_lib_type *)
       std::
       vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
       begin(in_stack_ffffffffffffff98);
  std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>::
  end((vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_> *)
      in_stack_ffffffffffffff98);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
    ::operator*(local_18);
    loader_impl_ext_handle_lib_type::loader_impl_ext_handle_lib_type
              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    if (local_30 != 0) {
      dynlink_unload(local_30);
    }
    loader_impl_ext_handle_lib_type::~loader_impl_ext_handle_lib_type
              ((loader_impl_ext_handle_lib_type *)0x10a427);
    __gnu_cxx::
    __normal_iterator<loader_impl_ext_handle_lib_type_*,_std::vector<loader_impl_ext_handle_lib_type,_std::allocator<loader_impl_ext_handle_lib_type>_>_>
    ::operator++(local_18);
  }
  if (local_8 != (void *)0x0) {
    loader_impl_ext_handle_type::~loader_impl_ext_handle_type
              ((loader_impl_ext_handle_type *)0x10a44b);
    operator_delete(local_8,0x18);
  }
  return;
}

Assistant:

void ext_loader_impl_destroy_handle(loader_impl_ext_handle ext_handle)
{
	for (auto ext : ext_handle->extensions)
	{
		if (ext.handle != NULL)
		{
			dynlink_unload(ext.handle);
		}
	}

	delete ext_handle;
}